

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerLockDb(Pager *pPager,int eLock)

{
  uint in_ESI;
  long in_RDI;
  int rc;
  int in_stack_ffffffffffffffec;
  int iVar1;
  
  iVar1 = 0;
  if (((int)(uint)*(byte *)(in_RDI + 0x16) < (int)in_ESI) || (*(char *)(in_RDI + 0x16) == '\x05')) {
    if (*(char *)(in_RDI + 0x11) == '\0') {
      iVar1 = sqlite3OsLock((sqlite3_file *)((ulong)in_ESI << 0x20),in_stack_ffffffffffffffec);
    }
    else {
      iVar1 = 0;
    }
    if ((iVar1 == 0) && ((*(char *)(in_RDI + 0x16) != '\x05' || (in_ESI == 4)))) {
      *(char *)(in_RDI + 0x16) = (char)in_ESI;
    }
  }
  return iVar1;
}

Assistant:

static int pagerLockDb(Pager *pPager, int eLock){
  int rc = SQLITE_OK;

  assert( eLock==SHARED_LOCK || eLock==RESERVED_LOCK || eLock==EXCLUSIVE_LOCK );
  if( pPager->eLock<eLock || pPager->eLock==UNKNOWN_LOCK ){
    rc = pPager->noLock ? SQLITE_OK : sqlite3OsLock(pPager->fd, eLock);
    if( rc==SQLITE_OK && (pPager->eLock!=UNKNOWN_LOCK||eLock==EXCLUSIVE_LOCK) ){
      pPager->eLock = (u8)eLock;
      IOTRACE(("LOCK %p %d\n", pPager, eLock))
    }
  }
  return rc;
}